

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<double>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<double> *this,vector<double,_std::allocator<double>_> *data)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  bool result;
  double tmp;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> local_38;
  pointer local_18 [2];
  
  local_18[0] = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(unaff_retaddr,in_RDI);
  bVar1 = ParameterTraits<double>::convert<std::vector<double,std::allocator<double>>>
                    (&local_38,(RepType *)local_18);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffc0);
  if (bVar1) {
    *(undefined1 *)
     ((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 2) = 0;
    in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_18[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }